

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O1

char * getPathWithoutFinalSlash(char *aoDestination,char *aSource)

{
  char *pcVar1;
  char *pcVar2;
  
  pcVar2 = aoDestination;
  if (aSource != (char *)0x0) {
    pcVar1 = strrchr(aSource,0x2f);
    if (pcVar1 == (char *)0x0) {
      pcVar1 = strrchr(aSource,0x5c);
    }
    if (pcVar1 != (char *)0x0) {
      strncpy(aoDestination,aSource,(long)pcVar1 - (long)aSource);
      pcVar2 = aoDestination + ((long)pcVar1 - (long)aSource);
    }
  }
  *pcVar2 = '\0';
  return aoDestination;
}

Assistant:

static char * getPathWithoutFinalSlash(
        char * aoDestination, /* make sure it is allocated, use _MAX_PATH */
        char const * aSource) /* aoDestination and aSource can be the same */
{
        char const * lTmp ;
        if ( aSource )
        {
                lTmp = strrchr(aSource, '/');
                if (!lTmp)
                {
                        lTmp = strrchr(aSource, '\\');
                }
                if (lTmp)
                {
                        strncpy(aoDestination, aSource, lTmp - aSource );
                        aoDestination[lTmp - aSource] = '\0';
                }
                else
                {
                        * aoDestination = '\0';
                }
        }
        else
        {
                * aoDestination = '\0';
        }
        return aoDestination;
}